

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

uint64_t __thiscall clunk::Node::QPerftSearch<false>(Node *this,int depth)

{
  int iVar1;
  bool bVar2;
  uint64_t uVar3;
  Move *move;
  uint64_t count;
  int depth_local;
  Node *this_local;
  
  if (depth < 1) {
    GenerateMoves<false,true>(this,depth);
    DAT_001aab68 = this->moveCount + DAT_001aab68;
  }
  else {
    GenerateMoves<false,false>(this,depth);
    DAT_001aab60 = this->moveCount + DAT_001aab60;
  }
  if ((this->child == (Node *)0x0 || this->moveCount == 0) || depth < 0) {
    this_local = (Node *)(long)(this->moveCount + 1);
  }
  else {
    move = (Move *)0x1;
    while( true ) {
      bVar2 = false;
      if (_stop == 0) {
        bVar2 = this->moveIndex < this->moveCount;
      }
      if (!bVar2) break;
      iVar1 = this->moveIndex;
      this->moveIndex = iVar1 + 1;
      Exec<false>(this,this->moves + iVar1,this->child);
      uVar3 = QPerftSearch<true>(this->child,depth + -1);
      move = (Move *)((long)&move->bits + uVar3);
      Undo<false>(this,this->moves + iVar1);
    }
    this_local = (Node *)move;
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t QPerftSearch(const int depth) {
    if (depth <= 0) {
      GenerateMoves<color, true>(depth);
      _stats.qnodes += moveCount;
    }
    else {
      GenerateMoves<color, false>(depth);
      _stats.snodes += moveCount;
    }
    if ((!child) | (!moveCount) | (depth < 0)) {
      return (moveCount + 1);
    }

    uint64_t count = 1;
    while (!_stop && (moveIndex < moveCount)) {
      const Move& move = moves[moveIndex++];
      Exec<color>(move, *child);
      count += child->QPerftSearch<!color>(depth - 1);
      Undo<color>(move);
    }
    return count;
  }